

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<std::pair<int,_QList<int>_>_>::copyAppend
          (QGenericArrayOps<std::pair<int,_QList<int>_>_> *this,pair<int,_QList<int>_> *b,
          pair<int,_QList<int>_> *e)

{
  pair<int,_QList<int>_> *this_00;
  ulong in_RDX;
  ulong in_RSI;
  pair<int,_QList<int>_> *in_RDI;
  pair<int,_QList<int>_> *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<std::pair<int,_QList<int>_>_>::begin
                        ((QArrayDataPointer<std::pair<int,_QList<int>_>_> *)0x8a8937);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      std::pair<int,_QList<int>_>::pair(this_00,in_RDI);
      local_10 = local_10 + 0x20;
      (in_RDI->second).d.ptr = (int *)((long)(in_RDI->second).d.ptr + 1);
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }